

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::format<char,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
               (BasicFormatter<char> *f,char **format_str,
               basic_string_view<char,_std::char_traits<char>_> *value)

{
  char *pcVar1;
  value_type *__value;
  ulong uVar2;
  FormatBuf<char> format_buf;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_ostream<char,_std::char_traits<char>_> output;
  anon_union_16_12_986ea841_for_Value_0 local_3c8;
  undefined4 local_3b8;
  undefined **local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  ostream_type *poStack_388;
  ostream_type *local_380;
  ostream_type *poStack_378;
  locale local_370 [8];
  undefined ***local_368;
  ostream_type *local_360;
  undefined **local_358;
  ostream_type *local_350;
  undefined8 local_348;
  ulong local_340;
  ostream_type local_338 [504];
  ostream_type local_140 [8];
  ios_base local_138 [264];
  
  local_350 = local_338;
  local_348 = 0;
  local_340 = 500;
  local_358 = &PTR_grow_00215768;
  local_3a8 = (undefined **)__cxa_guard_release;
  local_3a0 = 0;
  uStack_398 = 0;
  local_390 = 0;
  poStack_388 = (ostream_type *)0x0;
  local_380 = (ostream_type *)0x0;
  poStack_378 = (ostream_type *)0x0;
  std::locale::locale(local_370);
  local_3a8 = &PTR__streambuf_002168b0;
  local_368 = &local_358;
  local_360 = local_350;
  poStack_378 = local_350 + local_340;
  local_380 = local_350;
  poStack_388 = local_350;
  std::ostream::ostream(local_140,(streambuf *)&local_3a8);
  __value = value->__data;
  local_3c8.string.size = 0;
  if (0 < (long)value->__size) {
    uVar2 = value->__size + 1;
    local_3c8.pointer = local_140;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&local_3c8.string,__value)
      ;
      __value = __value + 1;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  local_3c8.custom.format = (FormatFunc)(local_380 + -(long)local_360);
  local_3c8.pointer = local_350;
  local_3b8 = 0xb;
  pcVar1 = BasicFormatter<char>::format(f,format_str,(Arg *)&local_3c8.string);
  *format_str = pcVar1;
  std::ios_base::~ios_base(local_138);
  local_3a8 = (undefined **)__cxa_guard_release;
  std::locale::~locale(local_370);
  local_358 = &PTR_grow_00215768;
  if (local_350 != local_338) {
    operator_delete(local_350,local_340);
  }
  return;
}

Assistant:

void format(BasicFormatter<Char> &f, const Char *&format_str, const T &value) {
  internal::MemoryBuffer<Char, internal::INLINE_BUFFER_SIZE> buffer;

  internal::FormatBuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output << value;

  BasicStringRef<Char> str(&buffer[0], format_buf.size());
  internal::Arg arg = internal::MakeValue<Char>(str);
  arg.type = static_cast<internal::Arg::Type>(
        internal::MakeValue<Char>::type(str));
  format_str = f.format(format_str, arg);
}